

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::Reference>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *result)

{
  StreamReader *pSVar1;
  bool bVar2;
  ulong uVar3;
  undefined7 in_register_00000011;
  int iVar4;
  bool triple_deliminated;
  allocator local_1a5;
  undefined4 local_1a4;
  char c;
  Reference ref;
  
  ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::clear(result);
  bVar2 = SkipWhitespaceAndNewline(this,true);
  if (bVar2) {
    Reference::Reference(&ref);
    triple_deliminated = false;
    bVar2 = ParseReference(this,&ref,&triple_deliminated);
    if (bVar2) {
      ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::push_back
                (result,&ref);
    }
    else {
      ::std::__cxx11::string::string((string *)&c,"Failed to parse Reference.\n",&local_1a5);
      PushError(this,(string *)&c);
      ::std::__cxx11::string::_M_dispose();
    }
    Reference::~Reference(&ref);
    if (bVar2) {
      local_1a4 = (undefined4)CONCAT71(in_register_00000011,end_symbol);
      do {
        bVar2 = Eof(this);
        if (bVar2) goto LAB_0030335c;
        bVar2 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar2) {
          return false;
        }
        bVar2 = Char1(this,&c);
        if (!bVar2) {
          return false;
        }
        if (c == sep) {
          bVar2 = SkipCommentAndWhitespaceAndNewline(this,true);
          if (!bVar2) {
            return false;
          }
          bVar2 = LookChar1(this,(char *)&ref);
          if (!bVar2) {
            return false;
          }
          iVar4 = 3;
          if ((char)ref.asset_path.asset_path_._M_dataplus._M_p != (char)local_1a4)
          goto LAB_003032e3;
        }
        else {
LAB_003032e3:
          if (c != sep) {
            pSVar1 = this->_sr;
            if ((0 < (long)pSVar1->idx_) && (uVar3 = pSVar1->idx_ - 1, uVar3 <= pSVar1->length_)) {
              pSVar1->idx_ = uVar3;
            }
            goto LAB_0030335c;
          }
          bVar2 = SkipWhitespaceAndNewline(this,true);
          if (!bVar2) {
            return false;
          }
          Reference::Reference(&ref);
          triple_deliminated = false;
          bVar2 = ParseReference(this,&ref,&triple_deliminated);
          iVar4 = 3;
          if (bVar2) {
            ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::push_back
                      (result,&ref);
            iVar4 = 0;
          }
          Reference::~Reference(&ref);
        }
      } while (iVar4 == 0);
      if (iVar4 != 1) {
LAB_0030335c:
        if ((result->super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>).
            _M_impl.super__Vector_impl_data._M_start !=
            (result->super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>).
            _M_impl.super__Vector_impl_data._M_finish) {
          return true;
        }
        ::std::__cxx11::string::string((string *)&ref,"Empty array.\n",(allocator *)&c);
        PushError(this,(string *)&ref);
        ::std::__cxx11::string::_M_dispose();
      }
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep,
                                  const char end_symbol,
                                  std::vector<Reference> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    Reference ref;
    bool triple_deliminated{false};

    if (!ParseReference(&ref, &triple_deliminated)) {
      PushError("Failed to parse Reference.\n");
      return false;
    }

    (void)triple_deliminated;

    result->push_back(ref);
  }

  while (!Eof()) {
    // sep
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    Reference ref;
    bool triple_deliminated{false};
    if (!ParseReference(&ref, &triple_deliminated)) {
      break;
    }

    (void)triple_deliminated;
    result->push_back(ref);
  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}